

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_attr_set_tiledesc(exr_context_t ctxt,int part_index,char *name,exr_attr_tiledesc_t *val)

{
  exr_attr_box2i_t *peVar1;
  uint32_t uVar2;
  int iVar3;
  exr_result_t eVar4;
  char *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  if ((name != (char *)0x0) && (iVar3 = strcmp(name,"tiles"), iVar3 == 0)) {
    if (val == (exr_attr_tiledesc_t *)0x0) {
      return 3;
    }
    eVar4 = exr_set_tile_descriptor
                      (ctxt,part_index,val->x_size,val->y_size,val->level_and_round & 0xf,
                       (uint)(val->level_and_round >> 4));
    return eVar4;
  }
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar4 = (**(code **)(ctxt + 0x48))(ctxt,4,"Part index (%d) out of range",part_index);
    return eVar4;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    uVar6 = 0x15;
LAB_0011b06e:
    eVar4 = (**(code **)(ctxt + 0x38))(ctxt,uVar6);
    return eVar4;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    uVar6 = 8;
    goto LAB_0011b06e;
  }
  list = (exr_attribute_list_t *)
         (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
  eVar4 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
  if (eVar4 == 0) {
    if (local_38->type != EXR_ATTR_TILEDESC) {
      pcVar7 = local_38->type_name;
      pcVar5 = "\'%s\' requested type \'tiledesc\', but stored attributes is type \'%s\'";
      uVar6 = 0x10;
      goto LAB_0011b13a;
    }
    if (val != (exr_attr_tiledesc_t *)0x0) goto LAB_0011b0f7;
  }
  else {
    if (eVar4 != 0xf) {
      return eVar4;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      return 0xf;
    }
    eVar4 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_TILEDESC,0,(uint8_t **)0x0,&local_38);
    if (val != (exr_attr_tiledesc_t *)0x0) {
      if (eVar4 != 0) {
        return eVar4;
      }
LAB_0011b0f7:
      peVar1 = (local_38->field_6).box2i;
      *(uint8_t *)&(peVar1->max).field_0 = val->level_and_round;
      uVar2 = val->y_size;
      *(int32_t *)&(peVar1->min).field_0 = val->x_size;
      *(uint32_t *)((long)&(peVar1->min).field_0 + 4) = uVar2;
      return 0;
    }
  }
  pcVar5 = "No input value for setting \'%s\', type \'%s\'";
  pcVar7 = "tiledesc";
  uVar6 = 3;
LAB_0011b13a:
  eVar4 = (**(code **)(ctxt + 0x48))(ctxt,uVar6,pcVar5,name,pcVar7);
  return eVar4;
}

Assistant:

exr_result_t
exr_attr_set_tiledesc (
    exr_context_t              ctxt,
    int                        part_index,
    const char*                name,
    const exr_attr_tiledesc_t* val)
{
    if (name && 0 == strcmp (name, EXR_REQ_TILES_STR))
    {
        if (!val) return EXR_ERR_INVALID_ARGUMENT;
        return exr_set_tile_descriptor (
            ctxt,
            part_index,
            val->x_size,
            val->y_size,
            EXR_GET_TILE_LEVEL_MODE (*val),
            EXR_GET_TILE_ROUND_MODE (*val));
    }

    ATTR_SET_IMPL_DEREF (EXR_ATTR_TILEDESC, tiledesc);
}